

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddApprox.c
# Opt level: O2

void updateParity(DdNode *node,ApproxInfo *info,int newparity)

{
  int iVar1;
  DdNode *node_00;
  NodeData *infoN;
  
  iVar1 = st__lookup(info->table,(char *)node,(char **)&infoN);
  if (((iVar1 != 0) && ((infoN->parity & newparity) == 0)) &&
     (infoN->parity = infoN->parity | (ushort)newparity,
     *(int *)((ulong)node & 0xfffffffffffffffe) != 0x7fffffff)) {
    updateParity((node->type).kids.T,info,newparity);
    node_00 = (node->type).kids.E;
    if (((ulong)node_00 & 1) != 0) {
      node_00 = (DdNode *)((ulong)node_00 & 0xfffffffffffffffe);
      newparity = 3 - newparity;
    }
    updateParity(node_00,info,newparity);
  }
  return;
}

Assistant:

static void
updateParity(
  DdNode * node /* function to analyze */,
  ApproxInfo * info /* info on BDD */,
  int  newparity /* new parity for node */)
{
    NodeData *infoN;
    DdNode *E;

    if (! st__lookup(info->table, (const char *)node, (char **)&infoN)) return;
    if ((infoN->parity & newparity) != 0) return;
    infoN->parity |= (short) newparity;
    if (Cudd_IsConstant(node)) return;
    updateParity(cuddT(node),info,newparity);
    E = cuddE(node);
    if (Cudd_IsComplement(E)) {
        updateParity(Cudd_Not(E),info,3-newparity);
    } else {
        updateParity(E,info,newparity);
    }
    return;

}